

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O0

void MIR_change_module_ctx(MIR_context_t old_ctx,MIR_module_t_conflict m,MIR_context_t new_ctx)

{
  MIR_insn_t_conflict pMVar1;
  MIR_alias_t MVar2;
  DLIST_MIR_module_t *pDVar3;
  c2mir_ctx *pcVar4;
  MIR_error_func_t p_Var5;
  MIR_item_t_conflict pMVar6;
  MIR_insn_t_conflict pMVar7;
  char *pcVar8;
  long lVar9;
  string local_88;
  ulong local_70;
  size_t i_1;
  MIR_insn_t_conflict insn;
  size_t i;
  reg_desc_t *rds;
  func_regs_t func_regs;
  char *new_name;
  char *name;
  MIR_item_t_conflict pMStack_30;
  MIR_op_mode_t mode;
  MIR_item_t_conflict tab_item;
  MIR_item_t_conflict item;
  MIR_context_t new_ctx_local;
  MIR_module_t_conflict m_local;
  MIR_context_t old_ctx_local;
  
  item = (MIR_item_t_conflict)new_ctx;
  new_ctx_local = (MIR_context_t)m;
  m_local = (MIR_module_t_conflict)old_ctx;
  pDVar3 = MIR_get_module_list(old_ctx);
  DLIST_MIR_module_t_remove(pDVar3,(MIR_module_t_conflict)new_ctx_local);
  pDVar3 = MIR_get_module_list((MIR_context_t)item);
  DLIST_MIR_module_t_append(pDVar3,(MIR_module_t_conflict)new_ctx_local);
  pcVar4 = (c2mir_ctx *)get_ctx_str((MIR_context_t)item,(char *)new_ctx_local->c2mir_ctx);
  new_ctx_local->c2mir_ctx = pcVar4;
  tab_item = DLIST_MIR_item_t_head((DLIST_MIR_item_t *)&new_ctx_local->error_func);
  do {
    if (tab_item == (MIR_item_t_conflict)0x0) {
      if (item[2].module < m_local[2].module_link.next) {
        item[2].module = m_local[2].module_link.next;
      }
      return;
    }
    if (tab_item->addr != (void *)0x0) {
      p_Var5 = MIR_get_error_func((MIR_context_t)m_local);
      (*p_Var5)(MIR_ctx_change_error,"Change context of a loaded module");
    }
    new_name = MIR_item_name((MIR_context_t)m_local,tab_item);
    if (new_name != (char *)0x0) {
      func_regs = (func_regs_t)get_ctx_str((MIR_context_t)item,new_name);
      pMVar6 = item_tab_find((MIR_context_t)m_local,new_name,(MIR_module_t_conflict)new_ctx_local);
      if (pMVar6 == tab_item) {
        item_tab_remove((MIR_context_t)m_local,tab_item);
        set_item_name(tab_item,(char *)func_regs);
        pMStack_30 = item_tab_insert((MIR_context_t)item,tab_item);
        if (tab_item != pMStack_30) {
          __assert_fail("item == tab_item",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                        ,0xb11,
                        "void MIR_change_module_ctx(MIR_context_t, MIR_module_t, MIR_context_t)");
        }
      }
      else {
        set_item_name(tab_item,(char *)func_regs);
      }
    }
    if (tab_item->item_type == MIR_proto_item) {
      change_var_names((MIR_context_t)item,((tab_item->u).proto)->args);
    }
    else if (tab_item->item_type == MIR_func_item) {
      rds = (reg_desc_t *)((tab_item->u).func)->internal;
      i = (size_t)VARR_reg_desc_taddr(*(VARR_reg_desc_t **)rds);
      for (insn = (MIR_insn_t_conflict)&DAT_00000001; pMVar1 = insn,
          pMVar7 = (MIR_insn_t_conflict)VARR_reg_desc_tlength(*(VARR_reg_desc_t **)rds),
          pMVar1 < pMVar7; insn = (MIR_insn_t_conflict)((long)&insn->data + 1)) {
        pcVar8 = get_ctx_str((MIR_context_t)item,*(char **)(i + (long)insn * 0x18 + 8));
        *(char **)(i + (long)insn * 0x18 + 8) = pcVar8;
        if (*(long *)(i + (long)insn * 0x18 + 0x10) != 0) {
          pcVar8 = get_ctx_str((MIR_context_t)item,*(char **)(i + (long)insn * 0x18 + 0x10));
          *(char **)(i + (long)insn * 0x18 + 0x10) = pcVar8;
        }
      }
      change_var_names((MIR_context_t)item,((tab_item->u).func)->vars);
      if (((tab_item->u).func)->global_vars != (VARR_MIR_var_t *)0x0) {
        change_var_names((MIR_context_t)item,((tab_item->u).func)->global_vars);
      }
      for (i_1 = (size_t)DLIST_MIR_insn_t_head(&((tab_item->u).func)->insns); i_1 != 0;
          i_1 = (size_t)DLIST_MIR_insn_t_next((MIR_insn_t_conflict)i_1)) {
        for (local_70 = 0; pMVar6 = item, local_70 < *(ulong *)(i_1 + 0x18) >> 0x20;
            local_70 = local_70 + 1) {
          name._4_4_ = (uint)(*(ushort *)(i_1 + local_70 * 0x30 + 0x28) & 0xff);
          if (name._4_4_ == 9) {
            lVar9 = i_1 + 0x20 + local_70 * 0x30;
            get_ctx_string(&local_88,(MIR_context_t)item,
                           *(MIR_str_t *)(i_1 + local_70 * 0x30 + 0x30));
            *(size_t *)(lVar9 + 0x10) = local_88.str.len;
            *(char **)(lVar9 + 0x18) = local_88.str.s;
          }
          else if (name._4_4_ == 10) {
            if (*(int *)(i_1 + local_70 * 0x30 + 0x34) != 0) {
              pcVar8 = MIR_alias_name((MIR_context_t)m_local,
                                      *(MIR_alias_t *)(i_1 + local_70 * 0x30 + 0x34));
              MVar2 = MIR_alias((MIR_context_t)pMVar6,pcVar8);
              *(MIR_alias_t *)(i_1 + local_70 * 0x30 + 0x34) = MVar2;
            }
            pMVar6 = item;
            if (*(int *)(i_1 + local_70 * 0x30 + 0x38) != 0) {
              pcVar8 = MIR_alias_name((MIR_context_t)m_local,
                                      *(MIR_alias_t *)(i_1 + local_70 * 0x30 + 0x38));
              MVar2 = MIR_alias((MIR_context_t)pMVar6,pcVar8);
              *(MIR_alias_t *)(i_1 + local_70 * 0x30 + 0x38) = MVar2;
            }
          }
        }
      }
    }
    tab_item = DLIST_MIR_item_t_next(tab_item);
  } while( true );
}

Assistant:

void MIR_change_module_ctx (MIR_context_t old_ctx, MIR_module_t m, MIR_context_t new_ctx) {
  MIR_item_t item, tab_item;
  MIR_op_mode_t mode;
  const char *name, *new_name;

  DLIST_REMOVE (MIR_module_t, *MIR_get_module_list (old_ctx), m);
  DLIST_APPEND (MIR_module_t, *MIR_get_module_list (new_ctx), m);
  m->name = get_ctx_str (new_ctx, m->name);
  for (item = DLIST_HEAD (MIR_item_t, m->items); item != NULL;
       item = DLIST_NEXT (MIR_item_t, item)) {
    if (item->addr != NULL)
      MIR_get_error_func (old_ctx) (MIR_ctx_change_error, "Change context of a loaded module");
    if ((name = MIR_item_name (old_ctx, item)) != NULL) {
      new_name = get_ctx_str (new_ctx, name);
      if (item_tab_find (old_ctx, name, m) != item) {
        set_item_name (item, new_name);
      } else {
        item_tab_remove (old_ctx, item);
        set_item_name (item, new_name);
        tab_item = item_tab_insert (new_ctx, item);
        mir_assert (item == tab_item);
      }
    }
    if (item->item_type == MIR_proto_item) {
      change_var_names (new_ctx, item->u.proto->args);
    } else if (item->item_type == MIR_func_item) {
      func_regs_t func_regs = item->u.func->internal;
      reg_desc_t *rds = VARR_ADDR (reg_desc_t, func_regs->reg_descs);

      for (size_t i = 1; i < VARR_LENGTH (reg_desc_t, func_regs->reg_descs); i++) {
        rds[i].name = (char *) get_ctx_str (new_ctx, rds[i].name);
        if (rds[i].hard_reg_name != NULL)
          rds[i].hard_reg_name = (char *) get_ctx_str (new_ctx, rds[i].hard_reg_name);
      }
      change_var_names (new_ctx, item->u.func->vars);
      if (item->u.func->global_vars != NULL) change_var_names (new_ctx, item->u.func->global_vars);

      for (MIR_insn_t insn = DLIST_HEAD (MIR_insn_t, item->u.func->insns); insn != NULL;
           insn = DLIST_NEXT (MIR_insn_t, insn)) {
        for (size_t i = 0; i < insn->nops; i++) {
          if ((mode = insn->ops[i].mode) == MIR_OP_STR) {
            insn->ops[i].u.str = get_ctx_string (new_ctx, insn->ops[i].u.str).str;
          } else if (mode == MIR_OP_MEM) {
            if (insn->ops[i].u.mem.alias != 0)
              insn->ops[i].u.mem.alias
                = MIR_alias (new_ctx, MIR_alias_name (old_ctx, insn->ops[i].u.mem.alias));
            if (insn->ops[i].u.mem.nonalias != 0)
              insn->ops[i].u.mem.nonalias
                = MIR_alias (new_ctx, MIR_alias_name (old_ctx, insn->ops[i].u.mem.nonalias));
          }
        }
      }
    }
  }
#undef curr_label_num
  if (new_ctx->curr_label_num < old_ctx->curr_label_num)
    new_ctx->curr_label_num = old_ctx->curr_label_num;
#define curr_label_num ctx->curr_label_num
}